

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O2

void Saig_ManDupIsoCanonical_rec(Aig_Man_t *pNew,Aig_Man_t *pAig,Aig_Obj_t *pObj)

{
  uint __line;
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  char *__assertion;
  Aig_Obj_t **ppAVar3;
  
  if (pObj->TravId != pAig->nTravIds) {
    pObj->TravId = pAig->nTravIds;
    if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
      __assertion = "Aig_ObjIsNode(pObj)";
      __line = 0x5e;
LAB_00594902:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigIso.c"
                    ,__line,
                    "void Saig_ManDupIsoCanonical_rec(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *)");
    }
    pAVar2 = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    if (((*(uint *)&pAVar2->field_0x18 & 7) - 7 < 0xfffffffe) ||
       (pAVar1 = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),
       (*(uint *)&pAVar1->field_0x18 & 7) - 7 < 0xfffffffe)) {
      Saig_ManDupIsoCanonical_rec(pNew,pAig,pAVar2);
      ppAVar3 = &pObj->pFanin1;
    }
    else {
      ppAVar3 = &pObj->pFanin0;
      if ((pAVar2->field_5).iData == (pAVar1->field_5).iData) {
        __assertion = "Aig_ObjFanin0(pObj)->iData != Aig_ObjFanin1(pObj)->iData";
        __line = 0x66;
        goto LAB_00594902;
      }
      if ((pAVar2->field_5).iData < (pAVar1->field_5).iData) {
        Saig_ManDupIsoCanonical_rec(pNew,pAig,pAVar2);
        ppAVar3 = &pObj->pFanin1;
      }
      else {
        Saig_ManDupIsoCanonical_rec(pNew,pAig,pAVar1);
      }
    }
    Saig_ManDupIsoCanonical_rec(pNew,pAig,(Aig_Obj_t *)((ulong)*ppAVar3 & 0xfffffffffffffffe));
    pAVar2 = Aig_ObjChild0Copy(pObj);
    pAVar1 = Aig_ObjChild1Copy(pObj);
    pAVar2 = Aig_And(pNew,pAVar2,pAVar1);
    (pObj->field_5).pData = pAVar2;
  }
  return;
}

Assistant:

void Saig_ManDupIsoCanonical_rec( Aig_Man_t * pNew, Aig_Man_t * pAig, Aig_Obj_t * pObj )
{
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    assert( Aig_ObjIsNode(pObj) );
    if ( !Aig_ObjIsNode(Aig_ObjFanin0(pObj)) || !Aig_ObjIsNode(Aig_ObjFanin1(pObj)) )
    {
        Saig_ManDupIsoCanonical_rec( pNew, pAig, Aig_ObjFanin0(pObj) );
        Saig_ManDupIsoCanonical_rec( pNew, pAig, Aig_ObjFanin1(pObj) );
    }
    else
    {
        assert( Aig_ObjFanin0(pObj)->iData != Aig_ObjFanin1(pObj)->iData );
        if ( Aig_ObjFanin0(pObj)->iData < Aig_ObjFanin1(pObj)->iData )
        {
            Saig_ManDupIsoCanonical_rec( pNew, pAig, Aig_ObjFanin0(pObj) );
            Saig_ManDupIsoCanonical_rec( pNew, pAig, Aig_ObjFanin1(pObj) );
        }
        else
        {
            Saig_ManDupIsoCanonical_rec( pNew, pAig, Aig_ObjFanin1(pObj) );
            Saig_ManDupIsoCanonical_rec( pNew, pAig, Aig_ObjFanin0(pObj) );
        }
    }
    pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
}